

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

predictor * __thiscall
Search::predictor::add_to<float>
          (predictor *this,v_array<float> *A,bool *A_is_ptr,float a,bool clear_first)

{
  float **ppfVar1;
  size_t sVar2;
  float *pfVar3;
  undefined1 in_CL;
  byte *in_RDX;
  v_array<float> *in_RSI;
  predictor *in_RDI;
  float in_XMM0_Da;
  size_t new_size;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  v_array<float> *in_stack_ffffffffffffffc0;
  v_array<float> *A_00;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar4;
  char cVar5;
  
  uVar4 = CONCAT13(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffff;
  cVar5 = (char)(uVar4 >> 0x18);
  if ((*in_RDX & 1) == 0) {
    if (cVar5 != '\0') {
      v_array<float>::clear(in_stack_ffffffffffffffc0);
    }
    v_array<float>::push_back
              (in_stack_ffffffffffffffc0,
               (float *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  else {
    if (cVar5 != '\0') {
      ppfVar1 = v_array<float>::begin(in_RSI);
      pfVar3 = *ppfVar1;
      ppfVar1 = v_array<float>::end(in_RSI);
      *ppfVar1 = pfVar3;
    }
    if ((uVar4 & 0x1000000) == 0) {
      sVar2 = v_array<float>::size(in_RSI);
      A_00 = (v_array<float> *)(sVar2 + 1);
    }
    else {
      A_00 = (v_array<float> *)0x1;
    }
    make_new_pointer<float>((predictor *)CONCAT44(in_XMM0_Da,uVar4),A_00,(size_t)in_RDI);
    *in_RDX = 0;
    pfVar3 = v_array<float>::operator[](in_RSI,(size_t)((long)&A_00[-1].erase_count + 7));
    *pfVar3 = in_XMM0_Da;
  }
  return in_RDI;
}

Assistant:

predictor& predictor::add_to(v_array<T>& A, bool& A_is_ptr, T a, bool clear_first)
{
  if (A_is_ptr)  // we need to make our own memory
  {
    if (clear_first)
      A.end() = A.begin();
    size_t new_size = clear_first ? 1 : (A.size() + 1);
    make_new_pointer<T>(A, new_size);
    A_is_ptr = false;
    A[new_size - 1] = a;
  }
  else  // we've already allocated our own memory
  {
    if (clear_first)
      A.clear();
    A.push_back(a);
  }
  return *this;
}